

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cse.c
# Opt level: O0

void dmrC_cleanup_and_cse(dmr_C *C,entrypoint *ep)

{
  int iVar1;
  instruction_list **listp;
  undefined1 local_50 [8];
  ptr_list_iter insniter__;
  instruction *last;
  instruction *insn;
  instruction_list **list;
  int i;
  entrypoint *ep_local;
  dmr_C *C_local;
  
  dmrC_simplify_memops(C,ep);
  do {
    C->L->repeat_phase = 0;
    clean_up_insns(C,ep);
    if ((C->L->repeat_phase & 3U) != 0) {
      dmrC_kill_unreachable_bbs(C,ep);
    }
    for (list._4_4_ = 0; list._4_4_ < 0x100; list._4_4_ = list._4_4_ + 1) {
      listp = C->L->insn_hash_table + list._4_4_;
      if (*listp != (instruction_list *)0x0) {
        iVar1 = dmrC_instruction_list_size(*listp);
        if (1 < iVar1) {
          sort_instruction_list(C,listp);
          insniter__.__nr = 0;
          insniter__._20_4_ = 0;
          ptrlist_forward_iterator((ptr_list_iter *)local_50,(ptr_list *)*listp);
          last = (instruction *)ptrlist_iter_next((ptr_list_iter *)local_50);
          while (last != (instruction *)0x0) {
            if (last->bb != (basic_block *)0x0) {
              if ((insniter__._16_8_ != 0) &&
                 (iVar1 = insn_compare(C,(void *)insniter__._16_8_,last), iVar1 == 0)) {
                last = try_to_cse(C,ep,(instruction *)insniter__._16_8_,last);
              }
              insniter__._16_8_ = last;
            }
            last = (instruction *)ptrlist_iter_next((ptr_list_iter *)local_50);
          }
        }
        ptrlist_remove_all((ptr_list **)listp);
      }
    }
    if ((C->L->repeat_phase & 2U) != 0) {
      dmrC_simplify_memops(C,ep);
    }
  } while ((C->L->repeat_phase & 1U) != 0);
  return;
}

Assistant:

void dmrC_cleanup_and_cse(struct dmr_C *C, struct entrypoint *ep)
{
	int i;

	dmrC_simplify_memops(C, ep);
repeat:
	C->L->repeat_phase = 0;
	clean_up_insns(C, ep);
	if (C->L->repeat_phase & REPEAT_CFG_CLEANUP)
		dmrC_kill_unreachable_bbs(C, ep);
	for (i = 0; i < INSN_HASH_SIZE; i++) {
		struct instruction_list **list = C->L->insn_hash_table + i;
		if (*list) {
			if (dmrC_instruction_list_size(*list) > 1) {
				struct instruction *insn, *last;

				sort_instruction_list(C, list);

				last = NULL;
				FOR_EACH_PTR(*list, insn) {
					if (!insn->bb)
						continue;
					if (last) {
						if (!insn_compare(C, last, insn))
							insn = try_to_cse(C, ep, last, insn);
					}
					last = insn;
				} END_FOR_EACH_PTR(insn);
			}
			ptrlist_remove_all((struct ptr_list **)list);
		}
	}

	if (C->L->repeat_phase & REPEAT_SYMBOL_CLEANUP)
		dmrC_simplify_memops(C, ep);

	if (C->L->repeat_phase & REPEAT_CSE)
		goto repeat;
}